

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::write_type(t_xml_generator *this,t_type *ttype)

{
  t_type *ptVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  string type;
  allocator local_179;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  get_type_name_abi_cxx11_(&local_178,(t_xml_generator *)ttype,ttype);
  std::__cxx11::string::string((string *)&local_38,"type",&local_179);
  std::__cxx11::string::string((string *)&local_58,(string *)&local_178);
  write_attribute(this,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = std::operator==(&local_178,"id");
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_78,"type-module",&local_179);
    std::__cxx11::string::string((string *)&local_98,(string *)&ttype->program_->name_);
    write_attribute(this,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_b8,"type-id",&local_179);
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::__cxx11::string::string((string *)&local_d8,(string *)CONCAT44(extraout_var,iVar3));
    write_attribute(this,&local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else {
    bVar2 = std::operator==(&local_178,"list");
    if (bVar2) {
      ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      std::__cxx11::string::string((string *)&local_f8,"elemType",&local_179);
      write_element_start(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      write_type(this,ptVar1);
      write_element_end(this);
    }
    else {
      bVar2 = std::operator==(&local_178,"set");
      if (bVar2) {
        ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
        std::__cxx11::string::string((string *)&local_118,"elemType",&local_179);
        write_element_start(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        write_type(this,ptVar1);
        write_element_end(this);
      }
      else {
        bVar2 = std::operator==(&local_178,"map");
        if (bVar2) {
          ptVar1 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          std::__cxx11::string::string((string *)&local_138,"keyType",&local_179);
          write_element_start(this,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          write_type(this,ptVar1);
          write_element_end(this);
          ptVar1 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
          std::__cxx11::string::string((string *)&local_158,"valueType",&local_179);
          write_element_start(this,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          write_type(this,ptVar1);
          write_element_end(this);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_178);
  return;
}

Assistant:

void t_xml_generator::write_type(t_type* ttype) {
  const string type = get_type_name(ttype);
  write_attribute("type", type);
  if (type == "id") {
    write_attribute("type-module", ttype->get_program()->get_name());
    write_attribute("type-id", ttype->get_name());
  } else if (type == "list") {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "set") {
    t_type* etype = ((t_set*)ttype)->get_elem_type();
    write_element_start("elemType");
    write_type(etype);
    write_element_end();
  } else if (type == "map") {
    t_type* ktype = ((t_map*)ttype)->get_key_type();
    write_element_start("keyType");
    write_type(ktype);
    write_element_end();
    t_type* vtype = ((t_map*)ttype)->get_val_type();
    write_element_start("valueType");
    write_type(vtype);
    write_element_end();
  }
}